

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sales.cpp
# Opt level: O1

void __thiscall
L15_4::LabeledSales::LabeledSales(LabeledSales *this,string *lb,int y,double *gr,int n)

{
  ulong uVar1;
  ulong uVar2;
  
  (this->super_Sales)._vptr_Sales = (_func_int **)&PTR__Sales_00134a80;
  (this->super_Sales)._year = y;
  if (n < 1) {
    uVar1 = 0;
  }
  else {
    uVar2 = 0xc;
    if (n < 0xc) {
      uVar2 = (ulong)(uint)n;
    }
    uVar1 = 0;
    do {
      (this->super_Sales)._gross[uVar1] = gr[uVar1];
      uVar1 = uVar1 + 1;
    } while (uVar2 != uVar1);
  }
  if ((uint)uVar1 < 0xc) {
    memset((this->super_Sales)._gross + (uVar1 & 0xffffffff),0,(ulong)(0xb - (uint)uVar1) * 8 + 8);
  }
  (this->super_Sales)._vptr_Sales = (_func_int **)&PTR__LabeledSales_00134ab0;
  (this->_label)._M_dataplus._M_p = (pointer)&(this->_label).field_2;
  (this->_label)._M_string_length = 0;
  (this->_label).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)&this->_label);
  return;
}

Assistant:

LabeledSales::LabeledSales(const std::string & lb, int y, const double *gr, int n): Sales(y, gr, n) {
        _label = lb;
    }